

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb-c.cpp
# Opt level: O3

duckdb_instance_cache duckdb_create_instance_cache(void)

{
  duckdb_instance_cache this;
  pointer __p;
  
  this = (duckdb_instance_cache)operator_new(8);
  *(tuple<duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_> *)this =
       (tuple<duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>)0x0;
  __p = (pointer)operator_new(0x60);
  (__p->db_instances)._M_h._M_buckets = &(__p->db_instances)._M_h._M_single_bucket;
  (__p->db_instances)._M_h._M_bucket_count = 1;
  (__p->db_instances)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__p->db_instances)._M_h._M_element_count = 0;
  (__p->db_instances)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__p->db_instances)._M_h._M_rehash_policy._M_next_resize = 0;
  (__p->db_instances)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__p->cache_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(__p->cache_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(__p->cache_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (__p->cache_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (__p->cache_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::__uniq_ptr_impl<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>_>::
  reset((__uniq_ptr_impl<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>_> *)
        this,__p);
  return this;
}

Assistant:

duckdb_instance_cache duckdb_create_instance_cache() {
	auto wrapper = new DBInstanceCacheWrapper();
	wrapper->instance_cache = duckdb::make_uniq<duckdb::DBInstanceCache>();
	return reinterpret_cast<duckdb_instance_cache>(wrapper);
}